

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsExport.cpp
# Opt level: O2

char * helicsBrokerGetAddress(HelicsBroker broker)

{
  int iVar1;
  Broker *pBVar2;
  undefined4 extraout_var;
  char *pcVar3;
  
  pBVar2 = getBroker(broker,(HelicsError *)0x0);
  if (pBVar2 == (Broker *)0x0) {
    pcVar3 = "";
  }
  else {
    iVar1 = (*pBVar2->_vptr_Broker[0xc])(pBVar2);
    pcVar3 = *(char **)CONCAT44(extraout_var,iVar1);
  }
  return pcVar3;
}

Assistant:

const char* helicsBrokerGetAddress(HelicsBroker broker)
{
    auto* brk = getBroker(broker, nullptr);
    if (brk == nullptr) {
        return nullstrPtr;
    }

    const auto& add = brk->getAddress();
    return add.c_str();
}